

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O3

mp_int * eddsa_signing_exponent_from_data
                   (eddsa_key *ek,ecsign_extra *extra,ptrlen r_encoded,ptrlen data)

{
  ssh_hash *psVar1;
  mp_int *pmVar2;
  ptrlen bytes;
  uchar hash [114];
  uchar local_a8 [120];
  
  psVar1 = (*extra->hash->new)(extra->hash);
  if (psVar1 != (ssh_hash *)0x0) {
    (*psVar1->vt->reset)(psVar1);
  }
  BinarySink_put_datapl(psVar1->binarysink_,extra->hash_prefix);
  BinarySink_put_datapl(psVar1->binarysink_,r_encoded);
  BinarySink_put_epoint(psVar1->binarysink_,ek->publicKey,ek->curve,true);
  BinarySink_put_datapl(psVar1->binarysink_,data);
  (*psVar1->vt->digest)(psVar1,local_a8);
  (*psVar1->vt->free)(psVar1);
  bytes.len = extra->hash->hlen;
  bytes.ptr = local_a8;
  pmVar2 = mp_from_bytes_le(bytes);
  smemclr(local_a8,extra->hash->hlen);
  return pmVar2;
}

Assistant:

static mp_int *eddsa_signing_exponent_from_data(
    struct eddsa_key *ek, const struct ecsign_extra *extra,
    ptrlen r_encoded, ptrlen data)
{
    /* Hash (r || public key || message) */
    unsigned char hash[MAX_HASH_LEN];
    ssh_hash *h = ssh_hash_new(extra->hash);
    put_datapl(h, extra->hash_prefix);
    put_datapl(h, r_encoded);
    put_epoint(h, ek->publicKey, ek->curve, true); /* omit string header */
    put_datapl(h, data);
    ssh_hash_final(h, hash);

    /* Convert to an integer */
    mp_int *toret = mp_from_bytes_le(make_ptrlen(hash, extra->hash->hlen));

    smemclr(hash, extra->hash->hlen);
    return toret;
}